

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neldermead.c
# Opt level: O0

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
           double eps,double *xf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  double *__ptr_00;
  void *__ptr_01;
  double *__ptr_02;
  double *__ptr_03;
  double *__ptr_04;
  void *__ptr_05;
  double *__ptr_06;
  double *__ptr_07;
  double dVar4;
  double dVar5;
  double dval;
  double s;
  double yavg;
  double ysum;
  double *xmin;
  double *xi;
  double *PL;
  double *PM;
  double *PSS;
  double *PS;
  double *PB;
  double *Y;
  double *P;
  double yss;
  double ys;
  double temp;
  double ynl;
  double ylo;
  double del;
  double fn;
  double ccoeff;
  double ecoeff;
  double rcoeff;
  double reqmin;
  int siter;
  int L;
  int ilo;
  int ihi;
  int ctl;
  int ct;
  int j;
  int i;
  int NN;
  int rcode;
  double eps_local;
  int *niter_local;
  int MAXITER_local;
  double fsval_local;
  double *dx_local;
  int N_local;
  double *xc_local;
  custom_function *funcpt_local;
  
  ylo = 1.0;
  iVar2 = N + 1;
  ihi = N * N;
  *niter = 0;
  dval = 1.0;
  ilo = 0;
  __ptr = malloc((long)N * 8 * (long)iVar2);
  __ptr_00 = (double *)malloc((long)iVar2 << 3);
  __ptr_01 = malloc((long)N << 3);
  __ptr_02 = (double *)malloc((long)N << 3);
  __ptr_03 = (double *)malloc((long)N << 3);
  __ptr_04 = (double *)malloc((long)N << 3);
  __ptr_05 = malloc((long)N << 3);
  __ptr_06 = (double *)malloc((long)N << 3);
  __ptr_07 = (double *)malloc((long)N << 3);
  for (ct = 0; ct < N; ct = ct + 1) {
    __ptr_06[ct] = xc[ct];
  }
  do {
    bVar1 = false;
    if (ilo == 0) {
      bVar1 = *niter < MAXITER;
    }
    if (!bVar1) {
      for (ct = 0; ct < N; ct = ct + 1) {
        xf[ct] = *(double *)((long)__ptr + (long)(N * N + ct) * 8);
      }
      if (*niter < MAXITER) {
        i = (int)(*niter < MAXITER);
      }
      else {
        i = 4;
      }
      free(__ptr_00);
      free(__ptr);
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_03);
      free(__ptr_04);
      free(__ptr_05);
      free(__ptr_06);
      free(__ptr_07);
      return i;
    }
    for (ct = 0; ct < N; ct = ct + 1) {
      *(double *)((long)__ptr + (long)(ihi + ct) * 8) = __ptr_06[ct];
    }
    dVar4 = (*funcpt->funcpt)(__ptr_06,N,funcpt->params);
    __ptr_00[N] = dVar4;
    for (ct = 0; ct < N; ct = ct + 1) {
      __ptr_06[ct] = dx[ct] * ylo + __ptr_06[ct];
      for (ctl = 0; ctl < N; ctl = ctl + 1) {
        *(double *)((long)__ptr + (long)(ct * N + ctl) * 8) = __ptr_06[ctl];
      }
      dVar4 = (*funcpt->funcpt)(__ptr_06,N,funcpt->params);
      __ptr_00[ct] = dVar4;
      __ptr_06[ct] = -dx[ct] * ylo + __ptr_06[ct];
    }
    ynl = *__ptr_00;
    siter = 0;
    for (ct = 1; ct < iVar2; ct = ct + 1) {
      if (__ptr_00[ct] < ynl) {
        ynl = __ptr_00[ct];
        siter = ct;
      }
    }
    for (ct = 0; ct < N; ct = ct + 1) {
      *(undefined8 *)((long)__ptr_05 + (long)ct * 8) =
           *(undefined8 *)((long)__ptr + (long)(siter * N + ct) * 8);
    }
    while( true ) {
      bVar1 = false;
      if (eps < ABS(dval)) {
        bVar1 = *niter < MAXITER;
      }
      if (!bVar1) break;
      *niter = *niter + 1;
      temp = *__ptr_00;
      L = 0;
      for (ct = 1; ct < iVar2; ct = ct + 1) {
        if (temp < __ptr_00[ct]) {
          temp = __ptr_00[ct];
          L = ct;
        }
      }
      for (ct = 0; ct < N; ct = ct + 1) {
        ys = 0.0;
        for (ctl = 0; ctl < iVar2; ctl = ctl + 1) {
          ys = *(double *)((long)__ptr + (long)(ctl * N + ct) * 8) + ys;
        }
        *(double *)((long)__ptr_01 + (long)ct * 8) =
             (ys - *(double *)((long)__ptr + (long)(L * N + ct) * 8)) / (double)N;
      }
      ihi = L * N;
      for (ct = 0; ct < N; ct = ct + 1) {
        __ptr_02[ct] = *(double *)((long)__ptr_01 + (long)ct * 8) * 2.0 +
                       -(*(double *)((long)__ptr + (long)(ihi + ct) * 8) * 1.0);
      }
      dVar4 = (*funcpt->funcpt)(__ptr_02,N,funcpt->params);
      if (ynl <= dVar4) {
        reqmin._4_4_ = 0;
        for (ct = 0; ct < iVar2; ct = ct + 1) {
          if (dVar4 < __ptr_00[ct]) {
            reqmin._4_4_ = reqmin._4_4_ + 1;
          }
        }
        if (reqmin._4_4_ == 0) {
          for (ct = 0; ct < N; ct = ct + 1) {
            __ptr_03[ct] = *(double *)((long)__ptr + (long)(ihi + ct) * 8) * 0.5 +
                           *(double *)((long)__ptr_01 + (long)ct * 8) * 0.5;
          }
          dVar5 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
          if (__ptr_00[L] < dVar5) {
            for (ct = 0; ct < iVar2; ct = ct + 1) {
              iVar3 = ct * N;
              for (ctl = 0; ctl < N; ctl = ctl + 1) {
                *(double *)((long)__ptr + (long)(iVar3 + ctl) * 8) =
                     (*(double *)((long)__ptr + (long)(iVar3 + ctl) * 8) +
                     *(double *)((long)__ptr_05 + (long)ctl * 8)) * 0.5;
                __ptr_04[ctl] = *(double *)((long)__ptr + (long)(iVar3 + ctl) * 8);
              }
              dVar5 = (*funcpt->funcpt)(__ptr_04,N,funcpt->params);
              __ptr_00[ct] = dVar5;
            }
            ynl = *__ptr_00;
            siter = 0;
            for (ct = 1; ct < iVar2; ct = ct + 1) {
              if (__ptr_00[ct] < ynl) {
                ynl = __ptr_00[ct];
                siter = ct;
              }
            }
            ihi = siter * N;
            for (ct = 0; ct < N; ct = ct + 1) {
              *(undefined8 *)((long)__ptr_05 + (long)ct * 8) =
                   *(undefined8 *)((long)__ptr + (long)(ihi + ct) * 8);
            }
          }
          else {
            for (ct = 0; ct < N; ct = ct + 1) {
              *(double *)((long)__ptr + (long)(ihi + ct) * 8) = __ptr_03[ct];
            }
            __ptr_00[L] = dVar5;
          }
        }
        if (reqmin._4_4_ == 1) {
          for (ct = 0; ct < N; ct = ct + 1) {
            __ptr_03[ct] = *(double *)((long)__ptr + (long)(ihi + ct) * 8) * 0.5 +
                           *(double *)((long)__ptr_01 + (long)ct * 8) * 0.5;
          }
          dVar5 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
          if (dVar4 < dVar5) {
            for (ct = 0; ct < N; ct = ct + 1) {
              *(double *)((long)__ptr + (long)(L * N + ct) * 8) = __ptr_02[ct];
            }
            __ptr_00[L] = dVar4;
          }
          else {
            for (ct = 0; ct < N; ct = ct + 1) {
              *(double *)((long)__ptr + (long)(L * N + ct) * 8) = __ptr_03[ct];
            }
            __ptr_00[L] = dVar5;
          }
        }
        if (1 < reqmin._4_4_) {
          for (ct = 0; ct < N; ct = ct + 1) {
            *(double *)((long)__ptr + (long)(L * N + ct) * 8) = __ptr_02[ct];
          }
          __ptr_00[L] = dVar4;
        }
      }
      else {
        for (ct = 0; ct < N; ct = ct + 1) {
          __ptr_03[ct] = __ptr_02[ct] * 2.0 + *(double *)((long)__ptr_01 + (long)ct * 8) * -1.0;
        }
        dVar5 = (*funcpt->funcpt)(__ptr_03,N,funcpt->params);
        if (dVar4 <= dVar5) {
          for (ct = 0; ct < N; ct = ct + 1) {
            *(double *)((long)__ptr + (long)(ihi + ct) * 8) = __ptr_02[ct];
          }
          __ptr_00[L] = dVar4;
        }
        else {
          for (ct = 0; ct < N; ct = ct + 1) {
            *(double *)((long)__ptr + (long)(ihi + ct) * 8) = __ptr_03[ct];
          }
          __ptr_00[L] = dVar5;
        }
      }
      if (__ptr_00[L] < ynl) {
        ynl = __ptr_00[L];
        siter = L;
      }
      yavg = 0.0;
      for (ctl = 0; ctl <= N; ctl = ctl + 1) {
        yavg = __ptr_00[ctl] + yavg;
      }
      dval = 0.0;
      for (ctl = 0; ctl <= N; ctl = ctl + 1) {
        dVar4 = pow(__ptr_00[ctl] - yavg / (double)(N + 1),2.0);
        dval = dVar4 + dval;
      }
      dval = sqrt(dval);
      if (ABS(dval) < eps) {
        ilo = 1;
      }
    }
    ihi = siter * N;
    for (ct = 0; ct < N; ct = ct + 1) {
      __ptr_07[ct] = *(double *)((long)__ptr + (long)(ihi + ct) * 8);
    }
    dVar4 = __ptr_00[siter];
    for (ct = 0; ct < N; ct = ct + 1) {
      ylo = dx[ct] * 0.001;
      __ptr_07[ct] = ylo + __ptr_07[ct];
      dVar5 = (*funcpt->funcpt)(__ptr_07,N,funcpt->params);
      if (dVar5 < dVar4) {
        ilo = 0;
        break;
      }
      __ptr_07[ct] = __ptr_07[ct] - (ylo + ylo);
      dVar5 = (*funcpt->funcpt)(__ptr_07,N,funcpt->params);
      if (dVar5 < dVar4) {
        ilo = 0;
        break;
      }
      ilo = ilo + 2;
    }
    if (ilo == 0) {
      for (ct = 0; ct < N; ct = ct + 1) {
        __ptr_06[ct] = __ptr_07[ct];
      }
      ylo = 0.001;
      dval = 1.0;
    }
  } while( true );
}

Assistant:

int nel_min(custom_function *funcpt,double *xc,int N,double *dx,double fsval,int MAXITER,int *niter,
		double eps,double *xf) {
	int rcode,NN,i,j,ct,ctl;
	int ihi,ilo,L,siter;
	double reqmin,rcoeff,ecoeff,ccoeff,fn,del;
	double ylo,ynl,temp,ys,yss;
	double *P,*Y,*PB,*PS,*PSS,*PM,*PL,*xi,*xmin;
	double ysum,yavg,s,dval;

	rcode = 0;
	reqmin = eps;
	rcoeff = 1.0;
	ecoeff = 2.0;
	ccoeff = 0.5;
	del = 1.0;
	NN = N + 1;
	ct = N * N;
	*niter = 0;
	siter = MAXITER;
	s = 1.0;
	ctl = 0;
	dval = 1.0e-03;

	P = (double*) malloc(sizeof(double) * N * NN);
	Y = (double*) malloc(sizeof(double) * NN);
	PB = (double*) malloc(sizeof(double) * N);
	PS = (double*) malloc(sizeof(double) * N);
	PSS = (double*) malloc(sizeof(double) * N);
	PM = (double*) malloc(sizeof(double) * N);
	PL = (double*) malloc(sizeof(double) * N);
	xi = (double*) malloc(sizeof(double) * N);
	xmin = (double*) malloc(sizeof(double) * N);

	for (i = 0; i < N;++i) {
		xi[i] = xc[i];
	}

	while (ctl == 0 && *niter < siter) {
		// Create N+1 point Simplex
		for (i = 0; i < N;++i) {
			P[ct + i] = xi[i];
		}

		fn = FUNCPT_EVAL(funcpt,xi,N);
		Y[N] = fn;


		for (i = 0; i < N;++i) {
			xi[i] += dx[i] * del;
			ct = i * N;
			for (j = 0; j < N;++j) {
				P[ct + j] = xi[j];
			}
			fn = FUNCPT_EVAL(funcpt, xi, N);
			Y[i] = fn;
			xi[i] -= dx[i] * del;
		}

		ylo = Y[0];
		ilo = 0;

		for (i = 1; i < NN;++i) {

			if (Y[i] < ylo) {
				ylo = Y[i];
				ilo = i;
			}
		}

		ct = ilo * N;

		for (i = 0; i < N;++i) {
			PL[i] = P[ct + i];
		}


		while (fabs(s) > reqmin && *niter < siter) {
			*niter = *niter + 1;

			// Find highest and lowest function values.

			ynl = Y[0];
			ihi = 0;

			for (i = 1; i < NN;++i) {

				if (Y[i] > ynl) {
					ynl = Y[i];
					ihi = i;
				}

			}


			// Find PB [Centroid]
			ct = N;
			for(i = 0; i < N;i++) {
				temp = 0.0;
				for ( j = 0; j < NN;++j) {
					temp += P[j*ct+i];
				}
				temp -= P[ihi*ct+i];
				PB[i] = temp / (double) N;
			}

			// Find reflection
			ct = ihi * N;
			for (i = 0; i < N;++i) {
				PS[i] = (1.0 + rcoeff) * PB[i] - rcoeff * P[ct+i];
			}
			ys = FUNCPT_EVAL(funcpt, PS, N);

			if (ys < ylo) {
				for (i = 0; i < N;++i) {
					PSS[i] = ecoeff * PS[i] + (1.0 - ecoeff) * PB[i];
				}
				yss = FUNCPT_EVAL(funcpt, PSS, N);

				if (yss < ys) {
					for(i = 0; i < N;++i) {
						P[ct + i] = PSS[i];
					}
					Y[ihi] = yss;
				} else {
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}


			} else {
				L = 0;
				for (i = 0; i < NN;++i) {
					if (Y[i] > ys) {
						L++;
					}
				}
	/*
				if (L == 1) {
					for ( i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;
				}*/
				if (L == 0) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= Y[ihi]) {
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {

						//ctl = ilo * N;
						for(i = 0; i < NN;++i) {
							ct = i * N;
							for (j = 0;j < N;++j) {
								P[ct + j] = 0.5 * (P[ct + j] + PL[j]);
								PM[j] = P[ct + j];
							}
							Y[i] = FUNCPT_EVAL(funcpt, PM, N);

						}
						ylo = Y[0];
						ilo = 0;

						for (i = 1; i < NN;++i) {

							if (Y[i] < ylo) {
								ylo = Y[i];
								ilo = i;
							}

						}
						ct = ilo * N;

						for (i = 0; i < N;++i) {
							PL[i] = P[ct + i];
						}
					}
				}
				if (L == 1) {
					for (i = 0; i < N;++i) {
						PSS[i] = ccoeff * P[ct + i] + (1.0 - ccoeff) * PB[i];
					}
					yss = FUNCPT_EVAL(funcpt, PSS, N);

					if (yss <= ys) {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PSS[i];
						}
						Y[ihi] = yss;

					} else {
						ct = ihi * N;
						for(i = 0; i < N;++i) {
							P[ct + i] = PS[i];
						}
						Y[ihi] = ys;

					}

				}


				if (L > 1) {
					ct = ihi * N;
					for(i = 0; i < N;++i) {
						P[ct + i] = PS[i];
					}
					Y[ihi] = ys;

				}
			}

			if (Y[ihi] < ylo) {
				ylo = Y[ihi];
				ilo = ihi;
			}

			//To the end of the loop
			ysum = 0.0;
			for (j=0 ;j <= N;j++) {
				ysum += Y[j];
			}
			yavg = ysum/(N+1);
			s = 0.0;
			for (j=0;j<=N;j++) {
				s += pow((Y[j]-yavg),2.0);
			}
			s = sqrt(s);//Remove this statement if you want convergence in fewer iterations
			if (fabs(s) < reqmin) {
				ctl = 1;
			}

		}
		ct = ilo * N;
		for(i = 0; i < N;++i) {
			xmin[i] = P[ct + i];
		}
		ynl = Y[ilo];

		for (i = 0; i < N;++i) {
			del = dx[i] * dval;
			xmin[i] += del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
			xmin[i] = xmin[i] - 2 * del;
			fn = FUNCPT_EVAL(funcpt, xmin, N);
			if (fn < ynl) {
				ctl = 0;
				break;
			} else {
				ctl++;
			}
		}

		if (ctl == 0) {
			for (i = 0; i < N;++i) {
				xi[i] = xmin[i];
			}
			del = dval;
			s = 1.0;
		}

	}

	ct = N * N;
	for (i = 0; i < N;++i) {
		xf[i] = P[ct + i];
	}

	if (rcode == 0 && *niter >= siter) {
		rcode = 4;
	} else if (*niter < siter) {
		rcode = 1;
	}


	free(Y);
	free(P);
	free(PB);
	free(PS);
	free(PSS);
	free(PM);
	free(PL);
	free(xi);
	free(xmin);
	return rcode;
}